

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O1

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  long id_1;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  if (id == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmPolicies.cxx"
                  ,0x17,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  sVar4 = strlen(id);
  if (sVar4 == 7) {
    local_28._M_len = strlen(id);
    __str._M_str = "CMP";
    __str._M_len = 3;
    local_28._M_str = id;
    iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_28,0,3,__str);
    if (iVar3 != 0) {
      return false;
    }
    local_28._M_len = strlen(id);
    local_28._M_str = id;
    if ((3 < local_28._M_len) &&
       (__str_00._M_str = "0000", __str_00._M_len = 4,
       iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                         (&local_28,local_28._M_len - 4,4,__str_00), iVar3 == 0)) {
      *pid = CMP0000;
      return true;
    }
    if ((int)id[3] - 0x30U < 10) {
      lVar1 = 0;
      do {
        lVar5 = lVar1;
        if (lVar5 == 3) goto LAB_00241fc9;
        lVar1 = lVar5 + 1;
      } while ((int)id[lVar5 + 4] - 0x30U < 10);
      if (5 < lVar5 + 3U) {
LAB_00241fc9:
        bVar2 = cmStrToLong(id + 3,(long *)&local_28);
        if ((bVar2) && ((long)local_28._M_len < 0x8f)) {
          *pid = (PolicyID)local_28._M_len;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool stringToId(const char* input, cmPolicies::PolicyID& pid)
{
  assert(input);
  if (strlen(input) != 7) {
    return false;
  }
  if (!cmHasLiteralPrefix(input, "CMP")) {
    return false;
  }
  if (cmHasLiteralSuffix(input, "0000")) {
    pid = cmPolicies::CMP0000;
    return true;
  }
  for (int i = 3; i < 7; ++i) {
    if (!isdigit(*(input + i))) {
      return false;
    }
  }
  long id;
  if (!cmStrToLong(input + 3, &id)) {
    return false;
  }
  if (id >= cmPolicies::CMPCOUNT) {
    return false;
  }
  pid = static_cast<cmPolicies::PolicyID>(id);
  return true;
}